

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::
_preBegin__profile_GLSL__technique__pass__states__stencil_mask_separate__mask
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  ParserChar *text;
  ParserChar *additionalText;
  uint8 uVar1;
  bool bVar2;
  bool bVar3;
  undefined8 in_RAX;
  uint8 *puVar4;
  StringHash SVar5;
  int iVar6;
  bool bVar7;
  xmlChar **ppxVar8;
  bool failed;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  puVar4 = (uint8 *)GeneratedSaxParser::StackMemoryManager::newObject
                              (&(this->
                                super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                                ).super_ParserTemplateBase.mStackMemoryManager,0x10);
  puVar4[0] = 0xff;
  puVar4[1] = '\0';
  puVar4[2] = '\0';
  puVar4[3] = '\0';
  puVar4[4] = '\0';
  puVar4[5] = '\0';
  puVar4[6] = '\0';
  puVar4[7] = '\0';
  puVar4[8] = '\0';
  puVar4[9] = '\0';
  puVar4[10] = '\0';
  puVar4[0xb] = '\0';
  puVar4[0xc] = '\0';
  puVar4[0xd] = '\0';
  puVar4[0xe] = '\0';
  puVar4[0xf] = '\0';
  *attributeDataPtr = puVar4;
  ppxVar8 = attributes->attributes;
  bVar7 = true;
  if (ppxVar8 != (xmlChar **)0x0) {
    do {
      text = *ppxVar8;
      if (text == (ParserChar *)0x0) {
        iVar6 = 3;
      }
      else {
        SVar5 = GeneratedSaxParser::Utils::calculateStringHash(text);
        additionalText = ppxVar8[1];
        ppxVar8 = ppxVar8 + 2;
        if (SVar5 == 0x76887d) {
          *(ParserChar **)(puVar4 + 8) = additionalText;
        }
        else if (SVar5 == 0x7c83b5) {
          uVar1 = GeneratedSaxParser::Utils::toUint8(additionalText,(bool *)((long)&uStack_38 + 7));
          *puVar4 = uVar1;
          if (uStack_38._7_1_ == '\x01') {
            bVar3 = false;
            bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0x7389b,0x7c83b5,additionalText);
            if (!bVar2) goto LAB_00734bee;
            iVar6 = 1;
          }
          else {
LAB_00734bee:
            iVar6 = 4;
            bVar3 = true;
          }
          if (!bVar3) goto LAB_00734bfd;
        }
        else {
          bVar3 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0x7389b,text,additionalText);
          iVar6 = 1;
          if (bVar3) goto LAB_00734bfd;
        }
        iVar6 = 0;
      }
LAB_00734bfd:
    } while (iVar6 == 0);
    if (iVar6 != 3) {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__profile_GLSL__technique__pass__states__stencil_mask_separate__mask( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__profile_GLSL__technique__pass__states__stencil_mask_separate__mask( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

profile_GLSL__technique__pass__states__stencil_mask_separate__mask__AttributeData* attributeData = newData<profile_GLSL__technique__pass__states__stencil_mask_separate__mask__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_VALUE:
    {
bool failed;
attributeData->value = GeneratedSaxParser::Utils::toUint8(attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_MASK,
        HASH_ATTRIBUTE_VALUE,
        attributeValue))
{
    return false;
}

    break;
    }
    case HASH_ATTRIBUTE_PARAM:
    {

attributeData->param = attributeValue;
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {
    ParserError::ErrorType simpleTypeValidationResult = validate__NCName(attributeData->param, strlen(attributeData->param));
    if (simpleTypeValidationResult != ParserError::SIMPLE_TYPE_VALIDATION_OK)
    {
        if( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
            simpleTypeValidationResult,
            HASH_ELEMENT_MASK,
            HASH_ATTRIBUTE_PARAM,
            attributeValue) )
        {
            return false;
        }
    }
    } // validation
#endif

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_MASK, attribute, attributeValue))
            {return false;}
    }
    }
    }
}


    return true;
}